

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  ImGuiContextHook *pIVar6;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var7;
  ImGuiViewportP *pIVar8;
  ImGuiWindow *pIVar9;
  ImGuiViewport **ppIVar10;
  ImGuiWindow **ppIVar11;
  unsigned_short *puVar12;
  ImVec2 IVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  ImU32 IVar23;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar24;
  ImGuiWindow *pIVar25;
  ImDrawList *pIVar26;
  ImGuiViewport *pIVar27;
  ImGuiViewport **ppIVar28;
  ImGuiWindow **ppIVar29;
  unsigned_short *__dest;
  int iVar30;
  ImGuiContext *g_4;
  char *pcVar31;
  char *label;
  char *pcVar32;
  ulong uVar33;
  ImGuiContext *g;
  byte bVar34;
  ImVec2 *pIVar35;
  ImGuiContext *g_2;
  ImGuiWindow *window;
  int iVar36;
  long lVar37;
  int iVar38;
  ImGuiContext *ctx;
  long lVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  ImRect outer;
  ImRect inner;
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [16];
  ImGuiContext *local_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar19 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1188,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x118d,"void ImGui::EndFrame()");
  }
  if (0 < (GImGui->Hooks).Size) {
    lVar37 = 0;
    lVar39 = 0;
    do {
      pIVar6 = (pIVar19->Hooks).Data;
      if (*(int *)(pIVar6 + lVar37) == 2) {
        (**(code **)(pIVar6 + lVar37 + 8))(pIVar19,pIVar6 + lVar37);
      }
      lVar39 = lVar39 + 1;
      lVar37 = lVar37 + 0x18;
    } while (lVar39 < (pIVar19->Hooks).Size);
  }
  bVar5 = (GImGui->IO).KeyCtrl;
  uVar41 = bVar5 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar41 = (uint)bVar5;
  }
  uVar42 = uVar41 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar42 = uVar41;
  }
  pIVar35 = (ImVec2 *)(ulong)uVar42;
  uVar41 = uVar42 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar41 = uVar42;
  }
  if ((uVar41 != 0) && ((GImGui->IO).KeyMods != uVar41)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1df1,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar36 = (GImGui->CurrentWindowStack).Size;
  if (iVar36 != 1) {
    if (1 < iVar36) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x1dfd,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1e03,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((GImGui->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1e07,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var7 = (pIVar19->PlatformIO).Platform_SetImeInputPos;
  if (p_Var7 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar43 = (pIVar19->PlatformImeLastPos).x;
    if ((((fVar43 == 3.4028235e+38) && (!NAN(fVar43))) ||
        (fVar43 = (pIVar19->PlatformImePos).x - fVar43,
        fVar44 = (pIVar19->PlatformImePos).y - (pIVar19->PlatformImeLastPos).y,
        0.0001 < fVar43 * fVar43 + fVar44 * fVar44)) &&
       ((pIVar8 = pIVar19->PlatformImePosViewport, pIVar8 != (ImGuiViewportP *)0x0 &&
        (pIVar8->PlatformWindowCreated == true)))) {
      (*p_Var7)(&pIVar8->super_ImGuiViewport,pIVar19->PlatformImePos);
      pIVar19->PlatformImeLastPos = pIVar19->PlatformImePos;
      pIVar19->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
  pIVar19->WithinFrameScopeWithImplicitWindow = false;
  local_80 = pIVar19;
  pIVar24 = pIVar19->CurrentWindow;
  if ((pIVar24 != (ImGuiWindow *)0x0) && (pIVar24->WriteAccessed == false)) {
    pIVar24->Active = false;
  }
  End();
  pIVar19 = GImGui;
  pIVar24 = GetTopMostPopupModal();
  local_68 = (ImVec2)pIVar19->NavWindowingTargetAnim;
  pIVar25 = (ImGuiWindow *)((ulong)pIVar24 | (ulong)local_68);
  if ((pIVar25 != (ImGuiWindow *)0x0) && (0 < (pIVar19->Viewports).Size)) {
    lVar37 = 0;
    local_98._0_8_ = (0x36 - (ulong)(pIVar24 == (ImGuiWindow *)0x0)) * 0x10;
    do {
      pIVar8 = (pIVar19->Viewports).Data[lVar37];
      if ((((pIVar24 == (ImGuiWindow *)0x0) || (pIVar8 != pIVar24->Viewport)) &&
          ((pIVar19->NavWindowingListWindow == (ImGuiWindow *)0x0 ||
           (pIVar8 != pIVar19->NavWindowingListWindow->Viewport)))) &&
         ((pIVar19->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
          (pIVar8 != pIVar19->NavWindowingTargetAnim->Viewport)))) {
        if ((pIVar24 != (ImGuiWindow *)0x0) &&
           (pIVar25 = pIVar8->Window, pIVar25 != (ImGuiWindow *)0x0)) {
          uVar33 = (ulong)(uint)(GImGui->Windows).Size;
          do {
            if ((int)uVar33 < 1) goto LAB_002e19fa;
            pIVar9 = (GImGui->Windows).Data[uVar33 - 1];
            bVar34 = (byte)pIVar35 & pIVar9 != pIVar24 | pIVar9 == pIVar25;
            pIVar35 = (ImVec2 *)(ulong)bVar34;
          } while ((pIVar9 != pIVar24) && (uVar33 = uVar33 - 1, pIVar9 != pIVar25));
          if (bVar34 != 0) goto LAB_002e1a8c;
        }
LAB_002e19fa:
        pIVar26 = GetViewportDrawList(pIVar8,1,"##Foreground");
        pIVar35 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + local_98._0_8_);
        local_a8._0_8_ = *pIVar35;
        IVar13 = pIVar35[1];
        fStack_9c = IVar13.y;
        local_a8._8_4_ = IVar13.x;
        fStack_9c = pIVar19->DimBgRatio * (GImGui->Style).Alpha * fStack_9c;
        IVar23 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
        pIVar35 = &(pIVar8->super_ImGuiViewport).Pos;
        local_a8._4_4_ = (pIVar8->super_ImGuiViewport).Pos.y + (pIVar8->super_ImGuiViewport).Size.y;
        local_a8._0_4_ = (pIVar8->super_ImGuiViewport).Pos.x + (pIVar8->super_ImGuiViewport).Size.x;
        ImDrawList::AddRectFilled(pIVar26,pIVar35,(ImVec2 *)local_a8,IVar23,0.0,0xf);
      }
LAB_002e1a8c:
      lVar37 = lVar37 + 1;
      pIVar25 = (ImGuiWindow *)(long)(pIVar19->Viewports).Size;
    } while (lVar37 < (long)pIVar25);
  }
  if ((local_68 != (ImVec2)0x0) &&
     (pIVar24 = pIVar19->NavWindowingTargetAnim, pIVar24->Active == true)) {
    pIVar25 = FindFrontMostVisibleChildWindow(pIVar25);
    pIVar26 = pIVar25->DrawList;
    ImDrawList::PushClipRectFullScreen(pIVar26);
    pIVar25 = pIVar24->RootWindowDockStop;
    if (((pIVar25->field_0x452 & 1) != 0) && (pIVar9 = pIVar24->RootWindow, pIVar9 != pIVar25)) {
      local_98._4_4_ = (pIVar9->Pos).y + (pIVar9->Size).y;
      local_98._0_4_ = (pIVar9->Pos).x + (pIVar9->Size).x;
      local_98._8_8_ = 0;
      local_68 = pIVar25->Pos;
      uStack_60 = 0;
      local_48 = pIVar9->Pos;
      uStack_40 = 0;
      local_a8._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x35);
      uVar14 = (GImGui->Style).Colors[0x35].z;
      uVar15 = (GImGui->Style).Colors[0x35].w;
      local_58.y = (pIVar25->Pos).y + (pIVar25->Size).y;
      local_58.x = (pIVar25->Pos).x + (pIVar25->Size).x;
      uStack_50 = 0;
      fStack_9c = pIVar19->DimBgRatio * (GImGui->Style).Alpha * (float)uVar15;
      local_a8._8_4_ = uVar14;
      IVar23 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
      auVar22 = local_98;
      outer.Max.x = (float)local_98._0_4_;
      outer.Max.y = (float)local_98._4_4_;
      outer.Min = local_48;
      inner.Max = local_58;
      inner.Min = local_68;
      local_98 = auVar22;
      RenderRectFilledWithHole(pIVar26,outer,inner,IVar23,(pIVar19->Style).WindowRounding);
    }
    fVar43 = pIVar24->WindowRounding;
    fVar44 = (pIVar19->Style).WindowRounding;
    uVar41 = -(uint)(fVar44 <= fVar43);
    local_98 = ZEXT416(~uVar41 & (uint)fVar44 | uVar41 & (uint)fVar43);
    fVar44 = pIVar19->FontSize;
    local_78.x = (pIVar24->Pos).x;
    local_78.y = (pIVar24->Pos).y;
    local_78.x = local_78.x - fVar44;
    local_78.y = local_78.y - fVar44;
    IStack_70.x = (pIVar24->Pos).x + (pIVar24->Size).x + fVar44;
    IStack_70.y = (pIVar24->Pos).y + (pIVar24->Size).y + fVar44;
    pIVar8 = pIVar24->Viewport;
    fVar3 = (pIVar8->super_ImGuiViewport).Pos.x;
    if ((((local_78.x <= fVar3) &&
         (fVar4 = (pIVar8->super_ImGuiViewport).Pos.y, local_78.y <= fVar4)) &&
        (fVar3 + (pIVar8->super_ImGuiViewport).Size.x <= IStack_70.x)) &&
       (fVar4 + (pIVar8->super_ImGuiViewport).Size.y <= IStack_70.y)) {
      fVar44 = -1.0 - fVar44;
      local_78.y = local_78.y - fVar44;
      local_78.x = local_78.x - fVar44;
      IStack_70.y = fVar44 + IStack_70.y;
      IStack_70.x = IStack_70.x + fVar44;
      local_98 = ZEXT416((uint)fVar43);
    }
    local_a8._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x34);
    uVar16 = (GImGui->Style).Colors[0x34].z;
    uVar17 = (GImGui->Style).Colors[0x34].w;
    fStack_9c = pIVar19->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar17;
    local_a8._8_4_ = uVar16;
    IVar23 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
    ImDrawList::AddRect(pIVar26,&local_78,&IStack_70,IVar23,(float)local_98._0_4_,-1,3.0);
    ImDrawList::PopClipRect(pIVar26);
  }
  pIVar19 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      IVar23 = ImHashStr("###NavWindowingList",0,0);
      pIVar24 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar19->WindowsById,IVar23);
      pIVar19->NavWindowingListWindow = pIVar24;
    }
    pIVar27 = GetMainViewport();
    pIVar18 = GImGui;
    fVar43 = (pIVar27->Size).x;
    fVar44 = (pIVar27->Size).y;
    uVar41 = (GImGui->NextWindowData).Flags;
    (GImGui->NextWindowData).Flags = uVar41 | 0x10;
    (pIVar18->NextWindowData).SizeConstraintRect.Min.x = fVar43 * 0.2;
    (pIVar18->NextWindowData).SizeConstraintRect.Min.y = fVar44 * 0.2;
    (pIVar18->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar18->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar18->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar18->NextWindowData).SizeCallbackUserData = (void *)0x0;
    fVar43 = (pIVar27->Size).x;
    fVar44 = (pIVar27->Size).y;
    fVar3 = (pIVar27->Pos).x;
    fVar4 = (pIVar27->Pos).y;
    (pIVar18->NextWindowData).Flags = uVar41 | 0x11;
    IVar13.y = fVar44 * 0.5 + fVar4;
    IVar13.x = fVar43 * 0.5 + fVar3;
    (pIVar18->NextWindowData).PosVal = IVar13;
    (pIVar18->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar18->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar18->NextWindowData).PosCond = 1;
    (pIVar18->NextWindowData).PosUndock = true;
    fVar43 = (pIVar19->Style).WindowPadding.x;
    fVar44 = (pIVar19->Style).WindowPadding.y;
    local_a8._4_4_ = fVar44 + fVar44;
    local_a8._0_4_ = fVar43 + fVar43;
    PushStyleVar(1,(ImVec2 *)local_a8);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar37 = (long)(pIVar19->WindowsFocusOrder).Size;
    if (0 < lVar37) {
      do {
        if ((pIVar19->WindowsFocusOrder).Size < lVar37) goto LAB_002e28b4;
        pIVar24 = (pIVar19->WindowsFocusOrder).Data[lVar37 + -1];
        if (((pIVar24->Active == true) && (pIVar24->RootWindowDockStop == pIVar24)) &&
           (uVar41 = pIVar24->Flags, (uVar41 >> 0x13 & 1) == 0)) {
          pcVar32 = pIVar24->Name;
          pcVar31 = pcVar32;
          if (pcVar32 != (char *)0xffffffffffffffff) {
            do {
              if (*pcVar31 == '#') {
                if (pcVar31[1] == '#') goto LAB_002e1f10;
              }
              else if (*pcVar31 == '\0') goto LAB_002e1f10;
              pcVar31 = pcVar31 + 1;
            } while (pcVar31 != (char *)0xffffffffffffffff);
            pcVar31 = (char *)0xffffffffffffffff;
          }
LAB_002e1f10:
          label = pcVar32;
          if ((pcVar32 == pcVar31) && (label = "(Popup)", (uVar41 >> 0x1a & 1) == 0)) {
            if ((uVar41 >> 10 & 1) != 0) {
              iVar36 = strcmp(pcVar32,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar36 == 0) goto LAB_002e1f5a;
            }
            label = "(Dock node)";
            if (pIVar24->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
LAB_002e1f5a:
          local_a8._0_4_ = 0.0;
          local_a8._4_4_ = 0.0;
          Selectable(label,pIVar19->NavWindowingTarget == pIVar24,0,(ImVec2 *)local_a8);
        }
        bVar5 = 1 < lVar37;
        lVar37 = lVar37 + -1;
      } while (bVar5);
    }
    End();
    PopStyleVar(1);
  }
  pIVar24 = pIVar19->NavWrapRequestWindow;
  if ((((pIVar24 != (ImGuiWindow *)0x0) && (pIVar19->NavWindow == pIVar24)) &&
      (GImGui->NavMoveRequest == true)) &&
     ((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
      ((pIVar19->NavMoveRequestForward == ImGuiNavForward_None &&
       (pIVar19->NavLayer == ImGuiNavLayer_Main)))))) {
    uVar41 = pIVar19->NavWrapRequestFlags;
    if (uVar41 == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x26c5,"void ImGui::NavEndFrame()");
    }
    local_a8._0_8_ = pIVar24->NavRectRel[0].Min;
    unique0x10000c7c = pIVar24->NavRectRel[0].Max;
    iVar36 = pIVar19->NavMoveDir;
    if (iVar36 == 0) {
      if ((uVar41 & 5) == 0) {
        iVar36 = 0;
      }
      else {
        fVar43 = (pIVar24->SizeFull).x;
        fVar44 = (pIVar24->WindowPadding).x;
        fVar44 = fVar44 + fVar44 + (pIVar24->ContentSize).x;
        uVar42 = -(uint)(fVar44 <= fVar43);
        fVar43 = (float)(uVar42 & (uint)fVar43 | ~uVar42 & (uint)fVar44) - (pIVar24->Scroll).x;
        iVar36 = 0;
        if ((uVar41 & 4) != 0) {
          fVar44 = fStack_9c - (float)local_a8._4_4_;
          local_a8._4_4_ = (float)local_a8._4_4_ - fVar44;
          fStack_9c = fStack_9c - fVar44;
          iVar36 = 2;
        }
        local_a8._8_4_ = fVar43;
        local_a8._0_4_ = fVar43;
        NavMoveRequestForward(0,iVar36,(ImRect *)local_a8,uVar41);
      }
    }
    if ((uVar41 & 5) != 0 && pIVar19->NavMoveDir == 1) {
      fVar43 = (pIVar24->Scroll).x;
      fVar44 = fStack_9c;
      stack0xffffffffffffff60 = (ImVec2)(CONCAT44(fStack_9c,fVar43) ^ 0x80000000);
      uVar20 = local_a8._4_4_;
      local_a8._0_8_ = CONCAT44(local_a8._4_4_,fVar43) ^ 0x80000000;
      if ((uVar41 & 4) != 0) {
        fVar43 = fVar44 - (float)uVar20;
        local_a8._4_4_ = (float)uVar20 + fVar43;
        fStack_9c = fVar43 + fVar44;
        iVar36 = 3;
      }
      NavMoveRequestForward(pIVar19->NavMoveDir,iVar36,(ImRect *)local_a8,uVar41);
    }
    if ((uVar41 & 10) != 0 && pIVar19->NavMoveDir == 2) {
      fVar43 = (pIVar24->SizeFull).y;
      fVar44 = (pIVar24->WindowPadding).y;
      fVar44 = fVar44 + fVar44 + (pIVar24->ContentSize).y;
      uVar42 = -(uint)(fVar44 <= fVar43);
      fVar43 = (float)(uVar42 & (uint)fVar43 | ~uVar42 & (uint)fVar44) - (pIVar24->Scroll).y;
      if ((uVar41 & 8) != 0) {
        fVar44 = (float)local_a8._8_4_ - (float)local_a8._0_4_;
        local_a8._0_4_ = (float)local_a8._0_4_ - fVar44;
        local_a8._8_4_ = (float)local_a8._8_4_ - fVar44;
        iVar36 = 0;
      }
      fStack_9c = fVar43;
      local_a8._4_4_ = fVar43;
      NavMoveRequestForward(pIVar19->NavMoveDir,iVar36,(ImRect *)local_a8,uVar41);
    }
    if (pIVar19->NavMoveDir == 3 && (uVar41 & 10) != 0) {
      fVar43 = (pIVar24->Scroll).y;
      uVar21 = local_a8._8_4_;
      stack0xffffffffffffff60 = (ImVec2)(CONCAT44(fVar43,local_a8._8_4_) ^ 0x8000000000000000);
      uVar20 = local_a8._0_4_;
      local_a8._0_8_ = CONCAT44(fVar43,local_a8._0_4_) ^ 0x8000000000000000;
      if ((uVar41 & 8) != 0) {
        fVar43 = (float)uVar21 - (float)uVar20;
        local_a8._0_4_ = (float)uVar20 + fVar43;
        local_a8._8_4_ = fVar43 + (float)uVar21;
        iVar36 = 1;
      }
      NavMoveRequestForward(pIVar19->NavMoveDir,iVar36,(ImRect *)local_a8,uVar41);
    }
  }
  pIVar18 = local_80;
  pIVar19 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar19->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  if (local_80->DragDropActive == true) {
    if ((local_80->DragDropPayload).DataFrameCount + 1 < local_80->FrameCount) {
      bVar34 = 1;
      if ((local_80->DragDropSourceFlags & 0x20) == 0) {
        if (4 < (ulong)(uint)local_80->DragDropMouseButton) {
          __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                        ,0x12da,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
        }
        bVar34 = (pIVar19->IO).MouseDown[(uint)local_80->DragDropMouseButton] ^ 1;
      }
    }
    else {
      bVar34 = 0;
    }
    if ((bVar34 != 0) || ((local_80->DragDropPayload).Delivery != false)) {
      ClearDragDrop();
    }
  }
  if (((pIVar18->DragDropActive == true) &&
      (pIVar18->DragDropSourceFrameCount < pIVar18->FrameCount)) &&
     ((pIVar18->DragDropSourceFlags & 1) == 0)) {
    pIVar18->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar18->DragDropWithinSource = false;
  }
  pIVar18->WithinFrameScope = false;
  pIVar18->FrameCountEnded = pIVar18->FrameCount;
  UpdateMouseMovingWindowEndFrame();
  pIVar19 = GImGui;
  if (0 < (GImGui->Viewports).Size) {
    (GImGui->PlatformIO).MainViewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
    iVar36 = (pIVar19->PlatformIO).Viewports.Capacity;
    if (iVar36 < 0) {
      uVar41 = iVar36 / 2 + iVar36;
      uVar33 = 0;
      if (0 < (int)uVar41) {
        uVar33 = (ulong)uVar41;
      }
      if (pIVar19 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar19->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar28 = (ImGuiViewport **)(*GImAllocatorAllocFunc)(uVar33 * 8,GImAllocatorUserData);
      ppIVar10 = (pIVar19->PlatformIO).Viewports.Data;
      if (ppIVar10 != (ImGuiViewport **)0x0) {
        memcpy(ppIVar28,ppIVar10,(long)(pIVar19->PlatformIO).Viewports.Size << 3);
        ppIVar10 = (pIVar19->PlatformIO).Viewports.Data;
        if ((ppIVar10 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
      }
      (pIVar19->PlatformIO).Viewports.Data = ppIVar28;
      (pIVar19->PlatformIO).Viewports.Capacity = (int)uVar33;
    }
    (pIVar19->PlatformIO).Viewports.Size = 0;
    if (0 < (pIVar19->Viewports).Size) {
      lVar37 = 0;
      do {
        pIVar8 = (pIVar19->Viewports).Data[lVar37];
        pIVar8->LastPos = (pIVar8->super_ImGuiViewport).Pos;
        if ((pIVar8->LastFrameActive < pIVar19->FrameCount) ||
           ((pIVar8->super_ImGuiViewport).Size.x <= 0.0)) {
          if (lVar37 == 0) goto LAB_002e2444;
        }
        else if ((lVar37 == 0) || (0.0 < (pIVar8->super_ImGuiViewport).Size.y)) {
LAB_002e2444:
          pIVar24 = pIVar8->Window;
          if ((pIVar24 == (ImGuiWindow *)0x0) ||
             ((pIVar24->Active == true && (pIVar24->Hidden == false)))) {
            if ((lVar37 != 0) && (pIVar24 == (ImGuiWindow *)0x0)) {
              __assert_fail("viewport->Window != __null",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                            ,0x2cad,"void ImGui::UpdateViewportsEndFrame()");
            }
            iVar36 = (pIVar19->PlatformIO).Viewports.Size;
            iVar38 = (pIVar19->PlatformIO).Viewports.Capacity;
            if (iVar36 == iVar38) {
              if (iVar38 == 0) {
                iVar30 = 8;
              }
              else {
                iVar30 = iVar38 / 2 + iVar38;
              }
              iVar36 = iVar36 + 1;
              if (iVar36 < iVar30) {
                iVar36 = iVar30;
              }
              if (iVar38 < iVar36) {
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + 1;
                }
                ppIVar28 = (ImGuiViewport **)
                           (*GImAllocatorAllocFunc)((long)iVar36 << 3,GImAllocatorUserData);
                ppIVar10 = (pIVar19->PlatformIO).Viewports.Data;
                if (ppIVar10 != (ImGuiViewport **)0x0) {
                  memcpy(ppIVar28,ppIVar10,(long)(pIVar19->PlatformIO).Viewports.Size << 3);
                  ppIVar10 = (pIVar19->PlatformIO).Viewports.Data;
                  if ((ppIVar10 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
                }
                (pIVar19->PlatformIO).Viewports.Data = ppIVar28;
                (pIVar19->PlatformIO).Viewports.Capacity = iVar36;
              }
            }
            (pIVar19->PlatformIO).Viewports.Data[(pIVar19->PlatformIO).Viewports.Size] =
                 &pIVar8->super_ImGuiViewport;
            pIVar2 = &(pIVar19->PlatformIO).Viewports;
            pIVar2->Size = pIVar2->Size + 1;
          }
        }
        pIVar18 = local_80;
        lVar37 = lVar37 + 1;
        iVar36 = (pIVar19->Viewports).Size;
      } while (lVar37 < iVar36);
      if (0 < iVar36) {
        pIVar8 = *(pIVar19->Viewports).Data;
        (pIVar8->super_ImGuiViewport).PlatformRequestMove = false;
        (pIVar8->super_ImGuiViewport).PlatformRequestResize = false;
        (pIVar8->super_ImGuiViewport).PlatformRequestClose = false;
        iVar36 = (local_80->WindowsTempSortBuffer).Capacity;
        if (iVar36 < 0) {
          uVar41 = iVar36 / 2 + iVar36;
          uVar33 = 0;
          if (0 < (int)uVar41) {
            uVar33 = (ulong)uVar41;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          ppIVar29 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar33 * 8,GImAllocatorUserData);
          ppIVar11 = (pIVar18->WindowsTempSortBuffer).Data;
          if (ppIVar11 != (ImGuiWindow **)0x0) {
            memcpy(ppIVar29,ppIVar11,(long)(pIVar18->WindowsTempSortBuffer).Size << 3);
            ppIVar11 = (pIVar18->WindowsTempSortBuffer).Data;
            if ((ppIVar11 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
          }
          (pIVar18->WindowsTempSortBuffer).Data = ppIVar29;
          (pIVar18->WindowsTempSortBuffer).Capacity = (int)uVar33;
        }
        (pIVar18->WindowsTempSortBuffer).Size = 0;
        iVar36 = (pIVar18->Windows).Size;
        if ((pIVar18->WindowsTempSortBuffer).Capacity < iVar36) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          ppIVar29 = (ImGuiWindow **)
                     (*GImAllocatorAllocFunc)((long)iVar36 << 3,GImAllocatorUserData);
          ppIVar11 = (pIVar18->WindowsTempSortBuffer).Data;
          if (ppIVar11 != (ImGuiWindow **)0x0) {
            memcpy(ppIVar29,ppIVar11,(long)(pIVar18->WindowsTempSortBuffer).Size << 3);
            ppIVar11 = (pIVar18->WindowsTempSortBuffer).Data;
            if ((ppIVar11 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
          }
          (pIVar18->WindowsTempSortBuffer).Data = ppIVar29;
          (pIVar18->WindowsTempSortBuffer).Capacity = iVar36;
        }
        uVar41 = (pIVar18->Windows).Size;
        uVar33 = (ulong)uVar41;
        if (uVar41 != 0) {
          uVar40 = 0;
          do {
            if ((long)(int)uVar33 <= (long)uVar40) goto LAB_002e28b4;
            pIVar24 = (pIVar18->Windows).Data[uVar40];
            if ((pIVar24->Active != true) || ((pIVar24->Flags & 0x1000000) == 0)) {
              AddWindowToSortBuffer(&pIVar18->WindowsTempSortBuffer,pIVar24);
            }
            uVar40 = uVar40 + 1;
            uVar41 = (pIVar18->Windows).Size;
            uVar33 = (ulong)uVar41;
          } while (uVar40 != uVar33);
        }
        uVar42 = (pIVar18->WindowsTempSortBuffer).Size;
        if (uVar41 != uVar42) {
          __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                        ,0x11d2,"void ImGui::EndFrame()");
        }
        (pIVar18->WindowsTempSortBuffer).Size = uVar41;
        (pIVar18->Windows).Size = uVar42;
        iVar36 = (pIVar18->WindowsTempSortBuffer).Capacity;
        (pIVar18->WindowsTempSortBuffer).Capacity = (pIVar18->Windows).Capacity;
        (pIVar18->Windows).Capacity = iVar36;
        ppIVar11 = (pIVar18->WindowsTempSortBuffer).Data;
        (pIVar18->WindowsTempSortBuffer).Data = (pIVar18->Windows).Data;
        (pIVar18->Windows).Data = ppIVar11;
        (pIVar18->IO).MetricsActiveWindows = pIVar18->WindowsActiveCount;
        ((pIVar18->IO).Fonts)->Locked = false;
        (pIVar18->IO).MouseWheel = 0.0;
        (pIVar18->IO).MouseWheelH = 0.0;
        iVar36 = (pIVar18->IO).InputQueueCharacters.Capacity;
        if (iVar36 < 0) {
          iVar36 = iVar36 / 2 + iVar36;
          iVar38 = 0;
          if (0 < iVar36) {
            iVar38 = iVar36;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (unsigned_short *)
                   (*GImAllocatorAllocFunc)((ulong)(uint)(iVar38 * 2),GImAllocatorUserData);
          puVar12 = (pIVar18->IO).InputQueueCharacters.Data;
          if (puVar12 != (unsigned_short *)0x0) {
            memcpy(__dest,puVar12,(long)(pIVar18->IO).InputQueueCharacters.Size * 2);
            puVar12 = (pIVar18->IO).InputQueueCharacters.Data;
            if ((puVar12 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(puVar12,GImAllocatorUserData);
          }
          (pIVar18->IO).InputQueueCharacters.Data = __dest;
          (pIVar18->IO).InputQueueCharacters.Capacity = iVar38;
        }
        (pIVar18->IO).InputQueueCharacters.Size = 0;
        (pIVar18->IO).NavInputs[0] = 0.0;
        (pIVar18->IO).NavInputs[1] = 0.0;
        (pIVar18->IO).NavInputs[2] = 0.0;
        (pIVar18->IO).NavInputs[3] = 0.0;
        (pIVar18->IO).NavInputs[4] = 0.0;
        (pIVar18->IO).NavInputs[5] = 0.0;
        (pIVar18->IO).NavInputs[6] = 0.0;
        (pIVar18->IO).NavInputs[7] = 0.0;
        (pIVar18->IO).NavInputs[8] = 0.0;
        (pIVar18->IO).NavInputs[9] = 0.0;
        (pIVar18->IO).NavInputs[10] = 0.0;
        (pIVar18->IO).NavInputs[0xb] = 0.0;
        (pIVar18->IO).NavInputs[0xc] = 0.0;
        (pIVar18->IO).NavInputs[0xd] = 0.0;
        (pIVar18->IO).NavInputs[0xe] = 0.0;
        (pIVar18->IO).NavInputs[0xf] = 0.0;
        (pIVar18->IO).NavInputs[0x10] = 0.0;
        (pIVar18->IO).NavInputs[0x11] = 0.0;
        (pIVar18->IO).NavInputs[0x12] = 0.0;
        (pIVar18->IO).NavInputs[0x13] = 0.0;
        (pIVar18->IO).NavInputs[0x14] = 0.0;
        if ((pIVar18->Hooks).Size < 1) {
          return;
        }
        lVar37 = 0;
        lVar39 = 0;
        do {
          pIVar6 = (pIVar18->Hooks).Data;
          if (*(int *)(pIVar6 + lVar37) == 3) {
            (**(code **)(pIVar6 + lVar37 + 8))(pIVar18,pIVar6 + lVar37);
          }
          lVar39 = lVar39 + 1;
          lVar37 = lVar37 + 0x18;
        } while (lVar39 < (pIVar18->Hooks).Size);
        return;
      }
    }
  }
  pcVar32 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_002e28c9:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                ,0x688,pcVar32);
LAB_002e28b4:
  pcVar32 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
  goto LAB_002e28c9;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}